

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table_iterators.h
# Opt level: O3

void __thiscall
draco::VertexRingIterator<draco::MeshAttributeCornerTable>::Next
          (VertexRingIterator<draco::MeshAttributeCornerTable> *this)

{
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar1;
  MeshAttributeCornerTable *pMVar2;
  uint uVar3;
  uint uVar4;
  
  pMVar2 = this->corner_table_;
  uVar3 = (this->corner_).value_;
  if (this->left_traversal_ == true) {
    if (uVar3 != 0xffffffff) {
      uVar4 = uVar3 - 2;
      if (0x55555555 < (uVar3 + 1) * -0x55555555) {
        uVar4 = uVar3 + 1;
      }
      if (((uVar4 != 0xffffffff) &&
          ((*(ulong *)(*(long *)&(pMVar2->is_edge_on_seam_).
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                      (ulong)(uVar4 >> 6) * 8) >> ((ulong)uVar4 & 0x3f) & 1) == 0)) &&
         (IVar1.value_ = (pMVar2->corner_table_->opposite_corners_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar4].value_,
         IVar1.value_ != 0xffffffff)) {
        uVar3 = IVar1.value_ - 2;
        if (0x55555555 < (IVar1.value_ + 1) * -0x55555555) {
          uVar3 = IVar1.value_ + 1;
        }
        (this->corner_).value_ = uVar3;
        if (uVar3 != 0xffffffff) {
          if (uVar3 != (this->start_corner_).value_) {
            return;
          }
          (this->corner_).value_ = 0xffffffff;
          return;
        }
      }
    }
    (this->corner_).value_ = (this->start_corner_).value_;
    this->left_traversal_ = false;
    return;
  }
  uVar4 = 0xffffffff;
  if (uVar3 != 0xffffffff) {
    if (uVar3 * -0x55555555 < 0x55555556) {
      uVar3 = uVar3 + 2;
      if (uVar3 == 0xffffffff) goto LAB_001494e1;
    }
    else {
      uVar3 = uVar3 - 1;
    }
    if (((*(ulong *)(*(long *)&(pMVar2->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>
                               ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                    (ulong)(uVar3 >> 6) * 8) >> ((ulong)uVar3 & 0x3f) & 1) == 0) &&
       (IVar1.value_ = (pMVar2->corner_table_->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar3].value_,
       IVar1.value_ != 0xffffffff)) {
      if (IVar1.value_ * -0x55555555 < 0x55555556) {
        uVar4 = IVar1.value_ + 2;
      }
      else {
        uVar4 = IVar1.value_ - 1;
      }
    }
  }
LAB_001494e1:
  (this->corner_).value_ = uVar4;
  return;
}

Assistant:

void Next() {
    if (left_traversal_) {
      corner_ = corner_table_->SwingLeft(corner_);
      if (corner_ == kInvalidCornerIndex) {
        // Open boundary reached.
        corner_ = start_corner_;
        left_traversal_ = false;
      } else if (corner_ == start_corner_) {
        // End reached.
        corner_ = kInvalidCornerIndex;
      }
    } else {
      // Go to the right until we reach a boundary there (no explicit check
      // is needed in this case).
      corner_ = corner_table_->SwingRight(corner_);
    }
  }